

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O2

void __thiscall
Assimp::OptimizeGraphProcess::SetupProperties(OptimizeGraphProcess *this,Importer *pImp)

{
  string tmp;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  Importer::GetPropertyString(&local_30,pImp,"PP_OG_EXCLUDE_LIST",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ConvertListToStrings(&local_30,&this->locked_nodes);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void OptimizeGraphProcess::SetupProperties(const Importer* pImp) {
    // Get value of AI_CONFIG_PP_OG_EXCLUDE_LIST
    std::string tmp = pImp->GetPropertyString(AI_CONFIG_PP_OG_EXCLUDE_LIST,"");
    AddLockedNodeList(tmp);
}